

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall
helics::CommsInterface::setMessageSize(CommsInterface *this,int maxMsgSize,int maxCount)

{
  bool bVar1;
  
  bVar1 = propertyLock(this);
  if (bVar1) {
    if (0 < maxMsgSize) {
      this->maxMessageSize = maxMsgSize;
    }
    if (0 < maxCount) {
      this->maxMessageCount = maxCount;
    }
    propertyUnLock(this);
    return;
  }
  return;
}

Assistant:

void CommsInterface::setMessageSize(int maxMsgSize, int maxCount)
{
    if (propertyLock()) {
        if (maxMsgSize > 0) {
            maxMessageSize = maxMsgSize;
        }
        if (maxCount > 0) {
            maxMessageCount = maxCount;
        }
        propertyUnLock();
    }
}